

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error externalParEntProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  XML_Bool XVar1;
  int tok;
  XML_Error XVar2;
  char *next;
  
  next = s;
  tok = (*parser->m_encoding->scanners[0])(parser->m_encoding,s,end,&next);
  if (tok < 1) {
    if ((tok != 0) && ((parser->m_parsingStatus).finalBuffer == '\0')) {
      *nextPtr = s;
      return XML_ERROR_NONE;
    }
    if (tok + 2U < 3) {
      return XML_ERROR_INVALID_TOKEN - tok;
    }
  }
  else if (tok == 0xe) {
    XVar1 = accountingDiffTolerated(parser,0xe,s,next,0x1217,XML_ACCOUNT_DIRECT);
    s = next;
    if (XVar1 == '\0') {
      accountingReportStats(parser," ABORTING\n");
      return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
    }
    tok = (*parser->m_encoding->scanners[0])(parser->m_encoding,next,end,&next);
  }
  parser->m_processor = prologProcessor;
  XVar2 = doProlog(parser,parser->m_encoding,s,end,tok,next,nextPtr,
                   (parser->m_parsingStatus).finalBuffer == '\0','\x01',XML_ACCOUNT_DIRECT);
  return XVar2;
}

Assistant:

static enum XML_Error PTRCALL
externalParEntProcessor(XML_Parser parser, const char *s, const char *end,
                        const char **nextPtr) {
  const char *next = s;
  int tok;

  tok = XmlPrologTok(parser->m_encoding, s, end, &next);
  if (tok <= 0) {
    if (! parser->m_parsingStatus.finalBuffer && tok != XML_TOK_INVALID) {
      *nextPtr = s;
      return XML_ERROR_NONE;
    }
    switch (tok) {
    case XML_TOK_INVALID:
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_NONE: /* start == end */
    default:
      break;
    }
  }
  /* This would cause the next stage, i.e. doProlog to be passed XML_TOK_BOM.
     However, when parsing an external subset, doProlog will not accept a BOM
     as valid, and report a syntax error, so we have to skip the BOM, and
     account for the BOM bytes.
  */
  else if (tok == XML_TOK_BOM) {
    if (! accountingDiffTolerated(parser, tok, s, next, __LINE__,
                                  XML_ACCOUNT_DIRECT)) {
      accountingOnAbort(parser);
      return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
    }

    s = next;
    tok = XmlPrologTok(parser->m_encoding, s, end, &next);
  }

  parser->m_processor = prologProcessor;
  return doProlog(parser, parser->m_encoding, s, end, tok, next, nextPtr,
                  (XML_Bool)! parser->m_parsingStatus.finalBuffer, XML_TRUE,
                  XML_ACCOUNT_DIRECT);
}